

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktInfoTests.cpp
# Opt level: O1

void vkt::createInfoTests(TestCaseGroup *testGroup)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"build","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Build Info","");
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d4f328;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::logBuildInfo;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"device","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Device Info","");
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d4f328;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::logDeviceInfo;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"platform","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Platform Info","");
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d4f328;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::logPlatformInfo;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"memory_limits","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Platform Memory Limits","");
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,(char *)local_50[0],
             (char *)local_70[0]);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d4f328;
  pTVar2[1].m_testCtx = (TestContext *)anon_unknown_0::logPlatformMemoryLimits;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void createInfoTests (tcu::TestCaseGroup* testGroup)
{
	addFunctionCase(testGroup, "build",			"Build Info",				logBuildInfo);
	addFunctionCase(testGroup, "device",		"Device Info",				logDeviceInfo);
	addFunctionCase(testGroup, "platform",		"Platform Info",			logPlatformInfo);
	addFunctionCase(testGroup, "memory_limits",	"Platform Memory Limits",	logPlatformMemoryLimits);
}